

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O3

int do_mkdir(int nargs,char **args)

{
  int iVar1;
  uint __owner;
  uint __group;
  ulong uVar2;
  int *piVar3;
  __mode_t __mode;
  
  __mode = 0x1ed;
  if (2 < nargs) {
    uVar2 = strtoul(args[2],(char **)0x0,8);
    __mode = (__mode_t)uVar2;
  }
  iVar1 = mkdir(args[1],__mode);
  if (iVar1 == 0) {
    if (nargs < 4) {
      return 0;
    }
    __owner = decode_uid(args[3]);
    __group = 0xffffffff;
    if (nargs == 5) {
      __group = decode_uid(args[4]);
    }
    iVar1 = chown(args[1],__owner,__group);
    if (iVar1 == 0) {
      return 0;
    }
  }
  piVar3 = __errno_location();
  return -*piVar3;
}

Assistant:

int do_mkdir(int nargs, char **args)
{
    mode_t mode = 0755;

    /* mkdir <path> [mode] [owner] [group] */

    if (nargs >= 3) {
        mode = strtoul(args[2], 0, 8);
    }

    if (mkdir(args[1], mode)) {
        return -errno;
    }

    if (nargs >= 4) {
        uid_t uid = decode_uid(args[3]);
        gid_t gid = -1;

        if (nargs == 5) {
            gid = decode_uid(args[4]);
        }

        if (chown(args[1], uid, gid)) {
            return -errno;
        }
    }

    return 0;
}